

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O3

bool __thiscall flow::lang::Lexer::continueParseRegEx(Lexer *this,char delim)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  Token TVar4;
  int iVar5;
  undefined7 in_register_00000031;
  int iVar6;
  
  (this->stringValue_)._M_string_length = 0;
  *(this->stringValue_)._M_dataplus._M_p = '\0';
  iVar3 = this->currentChar_;
  iVar5 = (int)CONCAT71(in_register_00000031,delim);
  if (iVar3 != -1) {
    iVar6 = -1;
    do {
      plVar1 = (long *)(this->contexts_).
                       super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next[1]._M_next[4]._M_next;
      if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 2) != 0) goto LAB_0013b1ed;
      if (iVar6 != 0x5c && iVar3 == iVar5) goto LAB_0013b1f8;
      std::__cxx11::string::push_back((char)this + -0x58);
      iVar6 = this->currentChar_;
      nextChar(this,true);
      iVar3 = this->currentChar_;
    } while (iVar3 != -1);
  }
  iVar3 = -1;
LAB_0013b1ed:
  bVar2 = false;
  TVar4 = Unknown;
  if (iVar3 == iVar5) {
LAB_0013b1f8:
    nextChar(this,true);
    TVar4 = RegExp;
    bVar2 = true;
  }
  this->token_ = TVar4;
  return bVar2;
}

Assistant:

bool Lexer::continueParseRegEx(char delim) {
  int last = -1;

  stringValue_.clear();

  while (!eof() && (currentChar() != delim || (last == '\\'))) {
    stringValue_ += static_cast<char>(currentChar());
    last = currentChar();
    nextChar();
  }

  if (currentChar() == delim) {
    nextChar();
    token_ = Token::RegExp;
    return true;
  }

  token_ = Token::Unknown;
  return false;
}